

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode header_append(Curl_easy *data,SingleRequest *k,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = k->hbuflen + length;
  if (uVar5 < 0x19001) {
    uVar6 = (data->state).headersize;
    if (uVar5 < uVar6) {
      pcVar4 = k->hbufp;
    }
    else {
      uVar5 = (uVar5 >> 1) + uVar5;
      uVar6 = uVar6 * 2;
      if (uVar6 < uVar5) {
        uVar6 = uVar5;
      }
      pcVar1 = k->hbufp;
      pcVar2 = (data->state).headerbuff;
      pcVar4 = (char *)(*Curl_crealloc)(pcVar2,uVar6);
      if (pcVar4 == (char *)0x0) {
        Curl_failf(data,"Failed to alloc memory for big header!");
        goto LAB_001138c8;
      }
      (data->state).headersize = uVar6;
      (data->state).headerbuff = pcVar4;
      pcVar4 = pcVar4 + ((long)pcVar1 - (long)pcVar2);
      k->hbufp = pcVar4;
    }
    memcpy(pcVar4,k->str_start,length);
    pcVar4 = k->hbufp;
    k->hbufp = pcVar4 + length;
    k->hbuflen = k->hbuflen + length;
    pcVar4[length] = '\0';
    CVar3 = CURLE_OK;
  }
  else {
    Curl_failf(data,"Rejected %zu bytes header (max is %d)!",uVar5,0x19000);
LAB_001138c8:
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  return CVar3;
}

Assistant:

static CURLcode header_append(struct Curl_easy *data,
                              struct SingleRequest *k,
                              size_t length)
{
  size_t newsize = k->hbuflen + length;
  if(newsize > CURL_MAX_HTTP_HEADER) {
    /* The reason to have a max limit for this is to avoid the risk of a bad
       server feeding libcurl with a never-ending header that will cause
       reallocs infinitely */
    failf(data, "Rejected %zu bytes header (max is %d)!", newsize,
          CURL_MAX_HTTP_HEADER);
    return CURLE_OUT_OF_MEMORY;
  }
  if(newsize >= data->state.headersize) {
    /* We enlarge the header buffer as it is too small */
    char *newbuff;
    size_t hbufp_index;

    newsize = CURLMAX((k->hbuflen + length) * 3 / 2, data->state.headersize*2);
    hbufp_index = k->hbufp - data->state.headerbuff;
    newbuff = realloc(data->state.headerbuff, newsize);
    if(!newbuff) {
      failf(data, "Failed to alloc memory for big header!");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.headersize = newsize;
    data->state.headerbuff = newbuff;
    k->hbufp = data->state.headerbuff + hbufp_index;
  }
  memcpy(k->hbufp, k->str_start, length);
  k->hbufp += length;
  k->hbuflen += length;
  *k->hbufp = 0;

  return CURLE_OK;
}